

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qendian.cpp
# Opt level: O0

void * qbswap<2>(void *source,qsizetype n,void *dest)

{
  long lVar1;
  uchar *src_00;
  uchar *in_RDX;
  long in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uchar *dst;
  uchar *src;
  size_t i;
  quintptr d;
  quintptr s;
  size_t size;
  unsigned_short dest_1;
  void *in_stack_ffffffffffffff78;
  uchar *local_50;
  uchar *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  src_00 = (uchar *)(in_RSI << 1);
  if (in_RDI != in_RDX) {
    in_stack_ffffffffffffffc0 = in_RDI;
  }
  for (local_50 = (uchar *)simdSwapLoop<unsigned_short>
                                     (src_00,(size_t)in_RDX,in_stack_ffffffffffffffc0);
      local_50 < src_00; local_50 = local_50 + 2) {
    qbswap<unsigned_short>(*(unsigned_short *)(in_RDI + (long)local_50),in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDX + (long)local_50;
}

Assistant:

void *qbswap<2>(const void *source, qsizetype n, void *dest) noexcept
{
    const uchar *src = reinterpret_cast<const uchar *>(source);
    uchar *dst = reinterpret_cast<uchar *>(dest);

    return bswapLoop<quint16>(src, n << 1, dst);
}